

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.cpp
# Opt level: O0

bool __thiscall HighsModel::operator==(HighsModel *this,HighsModel *model)

{
  byte bVar1;
  bool bVar2;
  HighsModel *in_RSI;
  bool equal;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  
  bVar1 = equalButForNames(in_RSI,(HighsModel *)
                                  CONCAT17(in_stack_ffffffffffffffef,
                                           CONCAT16(in_stack_ffffffffffffffee,
                                                    in_stack_ffffffffffffffe8)));
  bVar2 = HighsLp::equalNames(&in_RSI->lp_,
                              (HighsLp *)
                              CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffee,
                                                      in_stack_ffffffffffffffe8)));
  if (!bVar2) {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool HighsModel::operator==(const HighsModel& model) const {
  bool equal = equalButForNames(model);
  equal = this->lp_.equalNames(model.lp_) && equal;
  return equal;
}